

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::buildProgramToTestShaderStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage)

{
  byte bVar1;
  TestError *this_00;
  InternalError *this_01;
  char *local_70;
  char *vertex_shader_code;
  string tested_shader_stage_code;
  char *tesselation_evaluation_shader_code;
  char *tesselation_control_shader_code;
  GLuint program_object_id;
  bool is_program_built;
  char *geometry_shader_code;
  char *fragment_shader_code;
  ImageLoadStoreMultipleUniformsTest *pIStack_18;
  shaderStage stage_local;
  ImageLoadStoreMultipleUniformsTest *this_local;
  
  geometry_shader_code =
       "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
  ;
  _program_object_id = (char *)0x0;
  tesselation_control_shader_code._7_1_ = 1;
  tesselation_control_shader_code._0_4_ = 0;
  tesselation_evaluation_shader_code = (char *)0x0;
  tested_shader_stage_code.field_2._8_8_ = 0;
  fragment_shader_code._4_4_ = stage;
  pIStack_18 = this;
  std::__cxx11::string::string((string *)&vertex_shader_code);
  local_70 = 
  "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
  ;
  prepareShaderForTestedShaderStage(this,fragment_shader_code._4_4_,(string *)&vertex_shader_code);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    this_local._4_4_ = 0;
  }
  else {
    switch(fragment_shader_code._4_4_) {
    case fragmentShaderStage:
      geometry_shader_code = (char *)std::__cxx11::string::c_str();
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid shader stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                 ,0x237e);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    case geometryShaderStage:
      _program_object_id = (char *)std::__cxx11::string::c_str();
      break;
    case tesselationControlShaderStage:
      tesselation_evaluation_shader_code = (char *)std::__cxx11::string::c_str();
      tested_shader_stage_code.field_2._8_8_ = anon_var_dwarf_26d365;
      break;
    case tesselationEvalutaionShaderStage:
      tested_shader_stage_code.field_2._8_8_ = std::__cxx11::string::c_str();
      break;
    case vertexShaderStage:
      local_70 = (char *)std::__cxx11::string::c_str();
    }
    tesselation_control_shader_code._0_4_ =
         ShaderImageLoadStoreBase::BuildProgram
                   (&this->super_ShaderImageLoadStoreBase,local_70,
                    tesselation_evaluation_shader_code,
                    (char *)tested_shader_stage_code.field_2._8_8_,_program_object_id,
                    geometry_shader_code,(bool *)((long)&tesselation_control_shader_code + 7));
    this_local._4_4_ = (GLuint)tesselation_control_shader_code;
    if ((tesselation_control_shader_code._7_1_ & 1) == 0) {
      this_01 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_01,"Failed to build program","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                 ,0x2389);
      __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
  }
  std::__cxx11::string::~string((string *)&vertex_shader_code);
  return this_local._4_4_;
}

Assistant:

GLuint buildProgramToTestShaderStage(shaderStage stage)
	{
		static const char* const boilerplate_fragment_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    discard;\n"
			"}\n";

		static const char* const boilerplate_tesselation_evaluation_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(quads, equal_spacing, ccw) in;\n"
			"\n"
			"void main()\n"
			"{\n"
			"\n"
			"}\n";

		static const char* const boilerplate_vertex_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(location = 0) in vec4 i_position;\n"
			"\n"
			"void main()\n"
			"{\n"
			"  gl_Position = i_position;\n"
			"}\n";

		const char* fragment_shader_code			   = boilerplate_fragment_shader_code;
		const char* geometry_shader_code			   = 0;
		bool		is_program_built				   = true;
		GLuint		program_object_id				   = 0;
		const char* tesselation_control_shader_code	= 0;
		const char* tesselation_evaluation_shader_code = 0;
		std::string tested_shader_stage_code;
		const char* vertex_shader_code = boilerplate_vertex_shader_code;

		/* Get source code for tested shader stage */
		prepareShaderForTestedShaderStage(stage, tested_shader_stage_code);

		if (true == tested_shader_stage_code.empty())
		{
			return 0;
		}

		/* Set up source code for all required stages */
		switch (stage)
		{
		case fragmentShaderStage:
			fragment_shader_code = tested_shader_stage_code.c_str();
			break;

		case geometryShaderStage:
			geometry_shader_code = tested_shader_stage_code.c_str();
			break;

		case tesselationControlShaderStage:
			tesselation_control_shader_code	= tested_shader_stage_code.c_str();
			tesselation_evaluation_shader_code = boilerplate_tesselation_evaluation_shader_code;
			break;

		case tesselationEvalutaionShaderStage:
			tesselation_evaluation_shader_code = tested_shader_stage_code.c_str();
			break;

		case vertexShaderStage:
			vertex_shader_code = tested_shader_stage_code.c_str();
			break;

		default:
			TCU_FAIL("Invalid shader stage");
		}

		/* Build program */
		program_object_id =
			BuildProgram(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
						 geometry_shader_code, fragment_shader_code, &is_program_built);

		/* Check if program was built */
		if (false == is_program_built)
		{
			throw tcu::InternalError("Failed to build program", "", __FILE__, __LINE__);
		}

		/* Done */
		return program_object_id;
	}